

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day06a.cpp
# Opt level: O3

string * day6a::recover_message(string *__return_storage_ptr__,string *input)

{
  pair<char,_char> *ppVar1;
  long lVar2;
  char cVar3;
  char cVar4;
  undefined2 uVar5;
  pair<char,_char> *ppVar6;
  char *pcVar7;
  istream *piVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  char *pcVar13;
  char cVar14;
  char cVar15;
  size_type sVar16;
  pair<char,_char> *ppVar17;
  char *pcVar18;
  long lVar19;
  array<std::pair<char,_char>,_26UL> *letters;
  pair<char,_char> *ppVar20;
  string line;
  vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
  columns;
  istringstream stream;
  allocator_type local_1f1;
  string *local_1f0;
  undefined1 *local_1e8;
  size_type local_1e0;
  undefined1 local_1d8;
  undefined7 uStack_1d7;
  vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
  local_1c8;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)input,_S_in);
  local_1e8 = &local_1d8;
  local_1e0 = 0;
  local_1d8 = 0;
  std::operator>>((istream *)local_1b0,(string *)&local_1e8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)local_1e0);
  std::
  vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
  ::vector(&local_1c8,local_1e0,&local_1f1);
  do {
    if (local_1e0 != 0) {
      lVar12 = (long)local_1c8.
                     super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + -0xc2;
      sVar16 = 0;
      do {
        cVar14 = local_1e8[sVar16];
        *(char *)(lVar12 + (long)cVar14 * 2) = cVar14;
        pcVar13 = (char *)(lVar12 + (long)cVar14 * 2 + 1);
        *pcVar13 = *pcVar13 + '\x01';
        sVar16 = sVar16 + 1;
        lVar12 = lVar12 + 0x34;
      } while (local_1e0 != sVar16);
    }
    piVar8 = std::operator>>((istream *)local_1b0,(string *)&local_1e8);
  } while (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) == 0);
  if (local_1c8.
      super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1c8.
      super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar13 = &((pair<char,_char> *)
               ((long)local_1c8.
                      super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 0x20))->second;
    lVar12 = 0;
    ppVar20 = (local_1c8.
               super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_elems;
    local_1f0 = __return_storage_ptr__;
    do {
      ppVar1 = ppVar20 + 0x1a;
      std::
      __introsort_loop<std::pair<char,char>*,long,__gnu_cxx::__ops::_Iter_comp_iter<day6a::recover_message(std::__cxx11::string_const&)::__0>>
                (ppVar20,ppVar1,8);
      lVar9 = 2;
      lVar10 = 2;
      ppVar17 = ppVar20;
      do {
        cVar14 = ppVar17[1].first;
        cVar15 = ppVar17[1].second;
        if (ppVar20->second < ppVar17[1].second) {
          lVar19 = 0;
          do {
            ppVar17[lVar19 + 1] = ppVar17[lVar19];
            lVar2 = lVar9 + lVar19;
            lVar19 = lVar19 + -1;
          } while (1 < lVar2 - 1U);
          ppVar20->first = cVar14;
          ppVar20->second = cVar15;
        }
        else {
          ppVar6 = ppVar17 + 1;
          cVar4 = ppVar17->second;
          while (cVar4 < cVar15) {
            cVar3 = *(char *)((long)(ppVar6 + -2) + 1);
            ppVar6->first = ((array<std::pair<char,_char>,_26UL> *)(ppVar6 + -1))->_M_elems[0].first
            ;
            ppVar6->second = cVar4;
            ppVar6 = ppVar6 + -1;
            cVar4 = cVar3;
          }
          ppVar6->first = cVar14;
          ppVar6->second = cVar15;
        }
        lVar10 = lVar10 + 2;
        lVar9 = lVar9 + 1;
        ppVar17 = ppVar17 + 1;
      } while (lVar10 != 0x20);
      lVar9 = 0x20;
      pcVar11 = pcVar13;
      do {
        uVar5 = *(undefined2 *)(&ppVar20->first + lVar9);
        cVar14 = *(char *)((long)ppVar20 + lVar9 + -1);
        cVar15 = (char)((ushort)uVar5 >> 8);
        pcVar7 = pcVar11;
        if (cVar14 < cVar15) {
          do {
            pcVar18 = pcVar7;
            cVar4 = pcVar18[-4];
            ((pair<char,_char> *)(pcVar18 + -1))->first = pcVar18[-3];
            *pcVar18 = cVar14;
            pcVar7 = pcVar18 + -2;
            cVar14 = cVar4;
          } while (cVar4 < cVar15);
          pcVar18 = pcVar18 + -3;
        }
        else {
          pcVar18 = &ppVar20->first + lVar9;
        }
        *pcVar18 = (char)uVar5;
        pcVar18[1] = cVar15;
        lVar9 = lVar9 + 2;
        pcVar11 = pcVar11 + 2;
      } while (lVar9 != 0x34);
      (local_1f0->_M_dataplus)._M_p[lVar12] = ppVar20->first;
      lVar12 = lVar12 + 1;
      pcVar13 = pcVar13 + 0x34;
      __return_storage_ptr__ = local_1f0;
      ppVar20 = ppVar1;
    } while (ppVar1 != (local_1c8.
                        super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->_M_elems);
  }
  if ((local_1c8.
       super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_elems != (pair<char,_char> *)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string recover_message(const std::string& input) {
		std::istringstream stream(input);
		std::string line;
		stream >> line;
		std::string ret(line.size(), ' ');
		std::vector<std::array<std::pair<char, char>, 26>> columns(line.size());
		do {
			int i = 0;
			for(auto c : line) {
				auto& l = columns[i++][c - 'a'];
				l.first = c;
				l.second++;
			}
		} while(stream >> line);

		int i = 0;
		for(auto& letters : columns) {
			std::sort(letters.begin(), letters.end(), [](const auto& a, const auto& b) {
				return a.second > b.second;
			});
			ret[i++] = letters[0].first;
		}
		return ret;
	}